

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpc_lowmc.c
# Opt level: O1

void mpc_sbox_prove_s256_256
               (mzd_local_t *out,mzd_local_t *in,view_t *view,rvec_t *rvec,word256 mask_a,
               word256 mask_b,word256 mask_c)

{
  long lVar1;
  long lVar2;
  long lVar3;
  undefined1 auVar4 [32];
  undefined1 in_ZMM0 [64];
  undefined1 in_ZMM1 [64];
  undefined1 in_ZMM2 [64];
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  word256 x2m [3];
  word256 r2m [3];
  word256 r1s [3];
  word256 r1m [3];
  word256 r0s [3];
  word256 r0m [3];
  undefined1 local_340 [96];
  undefined1 auStack_2e0 [96];
  undefined1 auStack_280 [96];
  undefined1 auStack_220 [96];
  undefined1 auStack_1c0 [96];
  undefined1 auStack_160 [96];
  undefined1 auStack_100 [96];
  undefined1 auStack_a0 [152];
  
  lVar1 = 0;
  do {
    auVar4 = *(undefined1 (*) [32])((long)in->w64 + lVar1);
    auVar6 = vpand_avx2(auVar4,in_ZMM0._0_32_);
    auVar7 = vpsllq_avx2(auVar6,2);
    auVar6 = vpsrlq_avx2(auVar6,0x3e);
    auVar6 = vpermq_avx2(auVar6,0x93);
    auVar6 = vpor_avx2(auVar6,auVar7);
    *(undefined1 (*) [32])(auStack_2e0 + lVar1) = auVar6;
    auVar7 = vpand_avx2(auVar4,in_ZMM1._0_32_);
    auVar6 = vpaddq_avx2(auVar7,auVar7);
    auVar7 = vpsrlq_avx2(auVar7,0x3f);
    auVar7 = vpermq_avx2(auVar7,0x93);
    auVar6 = vpor_avx2(auVar7,auVar6);
    *(undefined1 (*) [32])(local_340 + lVar1) = auVar6;
    auVar4 = vpand_avx2(auVar4,in_ZMM2._0_32_);
    *(undefined1 (*) [32])(auStack_280 + lVar1) = auVar4;
    auVar4 = *(undefined1 (*) [32])((long)rvec + lVar1);
    auVar6 = vpand_avx2(auVar4,in_ZMM0._0_32_);
    auVar7 = vpsllq_avx2(auVar6,2);
    auVar6 = vpsrlq_avx2(auVar6,0x3e);
    auVar6 = vpermq_avx2(auVar6,0x93);
    auVar6 = vpor_avx2(auVar6,auVar7);
    *(undefined1 (*) [32])(auStack_100 + lVar1) = auVar6;
    auVar7 = vpand_avx2(auVar4,in_ZMM1._0_32_);
    auVar6 = vpaddq_avx2(auVar7,auVar7);
    auVar7 = vpsrlq_avx2(auVar7,0x3f);
    auVar7 = vpermq_avx2(auVar7,0x93);
    auVar6 = vpor_avx2(auVar7,auVar6);
    *(undefined1 (*) [32])(auStack_1c0 + lVar1) = auVar6;
    auVar4 = vpand_avx2(auVar4,in_ZMM2._0_32_);
    *(undefined1 (*) [32])(auStack_220 + lVar1) = auVar4;
    lVar1 = lVar1 + 0x20;
  } while (lVar1 != 0x60);
  lVar1 = 1;
  lVar2 = 0;
  do {
    lVar3 = 0;
    if (lVar2 != 0x40) {
      lVar3 = lVar1;
    }
    lVar3 = lVar3 * 0x20;
    auVar4 = vpternlogq_avx512vl(*(undefined1 (*) [32])(auStack_220 + lVar3) ^
                                 *(undefined1 (*) [32])(auStack_220 + lVar2),
                                 *(undefined1 (*) [32])(auStack_2e0 + lVar2) ^
                                 *(undefined1 (*) [32])(auStack_2e0 + lVar3),
                                 *(undefined1 (*) [32])(local_340 + lVar2),0x78);
    auVar4 = vpternlogq_avx512vl(auVar4,*(undefined1 (*) [32])(auStack_2e0 + lVar2),
                                 *(undefined1 (*) [32])(local_340 + lVar3),0x78);
    *(undefined1 (*) [32])(auStack_a0 + lVar2) = auVar4;
    *(undefined1 (*) [32])((long)view + lVar2) = auVar4;
    lVar2 = lVar2 + 0x20;
    lVar1 = lVar1 + 1;
  } while (lVar2 != 0x60);
  lVar1 = 1;
  lVar2 = 0;
  do {
    lVar3 = 0;
    if (lVar2 != 0x40) {
      lVar3 = lVar1;
    }
    lVar3 = lVar3 * 0x20;
    auVar4 = vpternlogq_avx512vl(*(undefined1 (*) [32])(auStack_1c0 + lVar3) ^
                                 *(undefined1 (*) [32])(auStack_1c0 + lVar2),
                                 *(undefined1 (*) [32])(local_340 + lVar2) ^
                                 *(undefined1 (*) [32])(local_340 + lVar3),
                                 *(undefined1 (*) [32])(auStack_280 + lVar2),0x78);
    auVar4 = vpternlogq_avx512vl(auVar4,*(undefined1 (*) [32])(local_340 + lVar2),
                                 *(undefined1 (*) [32])(auStack_280 + lVar3),0x78);
    *(undefined1 (*) [32])(auStack_220 + lVar2) = auVar4;
    auVar6 = vpsrlq_avx2(auVar4,1);
    auVar4 = vpsllq_avx2(auVar4,0x3f);
    auVar4 = vpermq_avx2(auVar4,0x39);
    auVar4 = vpternlogq_avx512vl(auVar4,auVar6,*(undefined1 (*) [32])((long)view + lVar2),0x56);
    *(undefined1 (*) [32])((long)view + lVar2) = auVar4;
    lVar2 = lVar2 + 0x20;
    lVar1 = lVar1 + 1;
  } while (lVar2 != 0x60);
  lVar1 = 1;
  lVar2 = 0;
  do {
    lVar3 = 0;
    if (lVar2 != 0x40) {
      lVar3 = lVar1;
    }
    lVar3 = lVar3 * 0x20;
    auVar4 = vpternlogq_avx512vl(*(undefined1 (*) [32])(auStack_100 + lVar3) ^
                                 *(undefined1 (*) [32])(auStack_100 + lVar2),
                                 *(undefined1 (*) [32])(auStack_2e0 + lVar2) ^
                                 *(undefined1 (*) [32])(auStack_2e0 + lVar3),
                                 *(undefined1 (*) [32])(auStack_280 + lVar2),0x78);
    auVar4 = vpternlogq_avx512vl(auVar4,*(undefined1 (*) [32])(auStack_2e0 + lVar2),
                                 *(undefined1 (*) [32])(auStack_280 + lVar3),0x78);
    *(undefined1 (*) [32])(auStack_160 + lVar2) = auVar4;
    auVar6 = vpsrlq_avx2(auVar4,2);
    auVar4 = vpsllq_avx2(auVar4,0x3e);
    auVar4 = vpermq_avx2(auVar4,0x39);
    auVar4 = vpternlogq_avx512vl(auVar4,auVar6,*(undefined1 (*) [32])((long)view + lVar2),0x56);
    *(undefined1 (*) [32])((long)view + lVar2) = auVar4;
    lVar2 = lVar2 + 0x20;
    lVar1 = lVar1 + 1;
  } while (lVar2 != 0x60);
  lVar1 = 0;
  do {
    auVar4 = *(undefined1 (*) [32])(auStack_2e0 + lVar1) ^
             *(undefined1 (*) [32])(auStack_220 + lVar1);
    *(undefined1 (*) [32])(auStack_220 + lVar1) = auVar4;
    auVar7 = *(undefined1 (*) [32])(auStack_2e0 + lVar1) ^ *(undefined1 (*) [32])(local_340 + lVar1)
    ;
    auVar6 = auVar7 ^ *(undefined1 (*) [32])(auStack_160 + lVar1);
    *(undefined1 (*) [32])(auStack_160 + lVar1) = auVar6;
    auVar7 = auVar7 ^ *(undefined1 (*) [32])(auStack_a0 + lVar1);
    *(undefined1 (*) [32])(auStack_a0 + lVar1) = auVar7;
    auVar5 = vpsrlq_avx2(auVar4,2);
    auVar4 = vpsllq_avx2(auVar4,0x3e);
    auVar4 = vpermq_avx2(auVar4,0x39);
    auVar4 = vpor_avx2(auVar4,auVar5);
    *(undefined1 (*) [32])(auStack_2e0 + lVar1) = auVar4;
    auVar5 = vpsrlq_avx2(auVar6,1);
    auVar6 = vpsllq_avx2(auVar6,0x3f);
    auVar6 = vpermq_avx2(auVar6,0x39);
    auVar6 = vpor_avx2(auVar6,auVar5);
    *(undefined1 (*) [32])(local_340 + lVar1) = auVar6;
    auVar4 = vpternlogq_avx512vl(auVar4 ^ *(undefined1 (*) [32])(auStack_280 + lVar1),auVar6,auVar7,
                                 0x96);
    *(undefined1 (*) [32])((long)out->w64 + lVar1) = auVar4;
    lVar1 = lVar1 + 0x20;
  } while (lVar1 != 0x60);
  return;
}

Assistant:

ATTR_TARGET_AVX2
static inline void mpc_sbox_prove_s256_256(mzd_local_t* out, const mzd_local_t* in, view_t* view,
                                           const rvec_t* rvec, const word256 mask_a,
                                           const word256 mask_b, const word256 mask_c) {
  bitsliced_mm256_step_1(SC_PROOF, mask_a, mask_b, mask_c);

  // a & b
  mpc_mm256_and_def(r0m, x0s, x1s, r2m, 0);
  // b & c
  mpc_mm256_and_def(r2m, x1s, x2m, r1s, 1);
  // c & a
  mpc_mm256_and_def(r1m, x0s, x2m, r0s, 2);

  bitsliced_mm256_step_2(SC_PROOF);
}